

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timsort.h
# Opt level: O0

int PUSH_NEXT(xmlNodePtr *dst,size_t size,TEMP_STORAGE_T *store,size_t minrun,
             TIM_SORT_RUN_T *run_stack,size_t *stack_curr,size_t *curr)

{
  ulong local_50;
  size_t run;
  size_t len;
  size_t *stack_curr_local;
  TIM_SORT_RUN_T *run_stack_local;
  size_t minrun_local;
  TEMP_STORAGE_T *store_local;
  size_t size_local;
  xmlNodePtr *dst_local;
  
  run = libxml_domnode_count_run(dst,*curr,size);
  local_50 = minrun;
  if (size - *curr < minrun) {
    local_50 = size - *curr;
  }
  if (run < local_50) {
    libxml_domnode_binary_insertion_sort_start(dst + *curr,run,local_50);
    run = local_50;
  }
  run_stack[*stack_curr].start = *curr;
  run_stack[*stack_curr].length = run;
  *stack_curr = *stack_curr + 1;
  *curr = run + *curr;
  if (*curr == size) {
    while (1 < *stack_curr) {
      libxml_domnode_tim_sort_merge(dst,run_stack,(int)*stack_curr,store);
      run_stack[*stack_curr - 2].length =
           run_stack[*stack_curr - 1].length + run_stack[*stack_curr - 2].length;
      *stack_curr = *stack_curr - 1;
    }
    if (store->storage != (xmlNodePtr *)0x0) {
      free(store->storage);
      store->storage = (xmlNodePtr *)0x0;
    }
    dst_local._4_4_ = 0;
  }
  else {
    dst_local._4_4_ = 1;
  }
  return dst_local._4_4_;
}

Assistant:

static __inline int PUSH_NEXT(SORT_TYPE *dst,
                              const size_t size,
                              TEMP_STORAGE_T *store,
                              const size_t minrun,
                              TIM_SORT_RUN_T *run_stack,
                              size_t *stack_curr,
                              size_t *curr) {
  size_t len = COUNT_RUN(dst, *curr, size);
  size_t run = minrun;

  if (run > size - *curr) {
    run = size - *curr;
  }

  if (run > len) {
    BINARY_INSERTION_SORT_START(&dst[*curr], len, run);
    len = run;
  }

  run_stack[*stack_curr].start = *curr;
  run_stack[*stack_curr].length = len;
  (*stack_curr)++;
  *curr += len;

  if (*curr == size) {
    /* finish up */
    while (*stack_curr > 1) {
      TIM_SORT_MERGE(dst, run_stack, *stack_curr, store);
      run_stack[*stack_curr - 2].length += run_stack[*stack_curr - 1].length;
      (*stack_curr)--;
    }

    if (store->storage != NULL) {
      free(store->storage);
      store->storage = NULL;
    }

    return 0;
  }

  return 1;
}